

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.c
# Opt level: O3

void lws_get_peer_addresses
               (lws *wsi,lws_sockfd_type fd,char *name,int name_len,char *rip,int rip_len)

{
  int iVar1;
  addrinfo *paVar2;
  int *piVar3;
  char *pcVar4;
  socklen_t len;
  sockaddr_in sin4;
  addrinfo *local_88;
  socklen_t local_7c;
  undefined2 local_78;
  undefined4 local_74 [3];
  sockaddr local_68;
  addrinfo local_58;
  
  *rip = '\0';
  *name = '\0';
  local_7c = 0x10;
  iVar1 = getpeername(fd,&local_68,&local_7c);
  if (iVar1 < 0) {
    piVar3 = __errno_location();
    pcVar4 = strerror(*piVar3);
    _lws_log(2,"getpeername: %s\n",pcVar4);
  }
  else {
    *rip = '\0';
    *name = '\0';
    local_58.ai_flags = 0;
    local_58.ai_family = 0;
    local_58.ai_addrlen = 0;
    local_58._20_4_ = 0;
    local_58.ai_addr = (sockaddr *)0x0;
    local_58.ai_canonname = (char *)0x0;
    local_58.ai_next = (addrinfo *)0x0;
    local_58.ai_socktype = 1;
    local_58.ai_protocol = 0;
    iVar1 = getnameinfo(&local_68,0x10,name,name_len,(char *)0x0,0,0);
    if ((iVar1 == 0) && (iVar1 = getaddrinfo(name,(char *)0x0,&local_58,&local_88), iVar1 == 0)) {
      if (local_88 != (addrinfo *)0x0) {
        paVar2 = local_88;
        do {
          if (paVar2->ai_family == 2) {
            local_74[0] = *(undefined4 *)(paVar2->ai_addr->sa_data + 2);
            local_78 = 2;
            freeaddrinfo(local_88);
            lws_plat_inet_ntop(2,local_74,rip,rip_len);
            return;
          }
          paVar2 = paVar2->ai_next;
        } while (paVar2 != (addrinfo *)0x0);
      }
      freeaddrinfo(local_88);
    }
  }
  return;
}

Assistant:

void
lws_get_peer_addresses(struct lws *wsi, lws_sockfd_type fd, char *name,
		       int name_len, char *rip, int rip_len)
{
#ifndef LWS_PLAT_OPTEE
	socklen_t len;
#ifdef LWS_WITH_IPV6
	struct sockaddr_in6 sin6;
#endif
	struct sockaddr_in sin4;
	void *p;

	rip[0] = '\0';
	name[0] = '\0';

#ifdef LWS_WITH_IPV6
	if (LWS_IPV6_ENABLED(wsi->vhost)) {
		len = sizeof(sin6);
		p = &sin6;
	} else
#endif
	{
		len = sizeof(sin4);
		p = &sin4;
	}

	if (getpeername(fd, p, &len) < 0) {
		lwsl_warn("getpeername: %s\n", strerror(LWS_ERRNO));
		goto bail;
	}

	lws_get_addresses(wsi->vhost, p, name, name_len, rip, rip_len);

bail:
#endif
	(void)wsi;
	(void)fd;
	(void)name;
	(void)name_len;
	(void)rip;
	(void)rip_len;
}